

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O2

UntypedActionResultHolderBase * __thiscall
testing::internal::FunctionMockerBase<long_long_()>::UntypedPerformAction
          (FunctionMockerBase<long_long_()> *this,void *untyped_action,void *untyped_args)

{
  ActionResultHolder<long_long> *pAVar1;
  Action<long_long_()> action;
  linked_ptr<testing::ActionInterface<long_long_()>_> local_20;
  
  linked_ptr<testing::ActionInterface<long_long()>>::copy<testing::ActionInterface<long_long()>>
            ((linked_ptr<testing::ActionInterface<long_long()>> *)&local_20,
             (linked_ptr<testing::ActionInterface<long_long_()>_> *)untyped_action);
  pAVar1 = ActionResultHolder<long_long>::PerformAction<long_long()>
                     ((Action<long_long_()> *)&local_20,(ArgumentTuple *)untyped_args);
  linked_ptr<testing::ActionInterface<long_long_()>_>::~linked_ptr(&local_20);
  return &pAVar1->super_UntypedActionResultHolderBase;
}

Assistant:

virtual UntypedActionResultHolderBase* UntypedPerformAction(
      const void* untyped_action, const void* untyped_args) const {
    // Make a copy of the action before performing it, in case the
    // action deletes the mock object (and thus deletes itself).
    const Action<F> action = *static_cast<const Action<F>*>(untyped_action);
    const ArgumentTuple& args =
        *static_cast<const ArgumentTuple*>(untyped_args);
    return ResultHolder::PerformAction(action, args);
  }